

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_sol.h
# Opt level: O2

void __thiscall
ExampleSOLHandler::OnIntSuffix<mp::SuffixReader<int>>(ExampleSOLHandler *this,SuffixReader<int> *sr)

{
  int iVar1;
  ExampleModel *pEVar2;
  mapped_type *this_00;
  pair<int,_int> pVar3;
  pointer pdVar4;
  key_type kStack_58;
  
  iVar1 = (sr->si_).kind_;
  pEVar2 = this->mdl_;
  std::__cxx11::string::string((string *)&kStack_58,(string *)&(sr->si_).name_);
  kStack_58.second = iVar1;
  this_00 = std::
            map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator[](&pEVar2->suf_out_,&kStack_58);
  std::__cxx11::string::~string((string *)&kStack_58);
  while ((sr->super_SparseVecReader<int>).n_ != 0) {
    pVar3 = mp::VecReader<std::pair<int,_int>_>::ReadNext(&sr->super_SparseVecReader<int>);
    pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <=
        (ulong)(long)pVar3.first) {
      std::vector<double,_std::allocator<double>_>::resize
                (this_00,((long)pVar3 << 0x20) + 0x100000000 >> 0x20);
      pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar4[pVar3.first] = (double)pVar3.second;
  }
  return;
}

Assistant:

void OnIntSuffix(SuffixReader& sr) {
    const auto& si = sr.SufInfo();
    int kind = si.Kind();
    const std::string& name = si.Name();
    assert(0 == (kind & 4));
    auto& suf_val = Model().suf_out_[std::make_pair(name, kind)];
    while (sr.Size()) {
      std::pair<int, int> val = sr.ReadNext();
      if (suf_val.size() <= val.first)
        suf_val.resize(val.first+1);
      suf_val[val.first] = val.second;
    }
  }